

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

int lyxml_dump_text(lyout *out,char *text)

{
  int iVar1;
  int local_28;
  uint local_24;
  uint n;
  uint i;
  char *text_local;
  lyout *out_local;
  
  if (text == (char *)0x0) {
    out_local._4_4_ = 0;
  }
  else {
    local_28 = 0;
    for (local_24 = 0; text[local_24] != '\0'; local_24 = local_24 + 1) {
      switch(text[local_24]) {
      case '\"':
        iVar1 = ly_print(out,"&quot;");
        local_28 = iVar1 + local_28;
        break;
      default:
        ly_write(out,text + local_24,1);
        local_28 = local_28 + 1;
        break;
      case '&':
        iVar1 = ly_print(out,"&amp;");
        local_28 = iVar1 + local_28;
        break;
      case '<':
        iVar1 = ly_print(out,"&lt;");
        local_28 = iVar1 + local_28;
        break;
      case '>':
        iVar1 = ly_print(out,"&gt;");
        local_28 = iVar1 + local_28;
      }
    }
    out_local._4_4_ = local_28;
  }
  return out_local._4_4_;
}

Assistant:

int
lyxml_dump_text(struct lyout *out, const char *text)
{
    unsigned int i, n;

    if (!text) {
        return 0;
    }

    for (i = n = 0; text[i]; i++) {
        switch (text[i]) {
        case '&':
            n += ly_print(out, "&amp;");
            break;
        case '<':
            n += ly_print(out, "&lt;");
            break;
        case '>':
            /* not needed, just for readability */
            n += ly_print(out, "&gt;");
            break;
        case '"':
            n += ly_print(out, "&quot;");
            break;
        default:
            ly_write(out, &text[i], 1);
            n++;
        }
    }

    return n;
}